

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::InitializeConnectionRequest::ParseFromArray
          (InitializeConnectionRequest *this,void *raw,size_t size)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong *puVar8;
  uint8_t cur_byte_2;
  InitializeConnectionRequest_ProducerSMBScrapingMode IVar9;
  uint8_t cur_byte;
  ulong uVar10;
  uint8_t cur_byte_1;
  ulong *puVar11;
  Field local_60;
  string *local_50;
  string *local_48;
  string *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  (this->unknown_fields_)._M_string_length = 0;
  local_38 = &this->unknown_fields_;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar7 = (ulong *)(size + (long)raw);
  do {
    if (puVar7 <= raw) goto switchD_00259a69_caseD_3;
    bVar1 = (byte)*raw;
    uVar6 = (ulong)bVar1;
    puVar8 = (ulong *)((long)raw + 1);
    if ((char)bVar1 < '\0') {
      uVar6 = (ulong)(bVar1 & 0x7f);
      lVar4 = 7;
      do {
        if ((puVar7 <= puVar8) || (0x38 < lVar4 - 7U)) goto switchD_00259a69_caseD_3;
        uVar3 = *puVar8;
        puVar8 = (ulong *)((long)puVar8 + 1);
        uVar6 = uVar6 | (ulong)((byte)uVar3 & 0x7f) << ((byte)lVar4 & 0x3f);
        lVar4 = lVar4 + 7;
      } while ((char)(byte)uVar3 < '\0');
    }
    uVar3 = uVar6 >> 3;
    if (((uint)uVar3 == 0) || (puVar7 <= puVar8)) goto switchD_00259a69_caseD_3;
    switch((uint)uVar6 & 7) {
    case 0:
      uVar5 = 0;
      uVar10 = 0;
      while( true ) {
        puVar11 = (ulong *)((long)puVar8 + 1);
        uVar5 = (ulong)((byte)*puVar8 & 0x7f) << ((byte)uVar10 & 0x3f) | uVar5;
        if (-1 < (char)(byte)*puVar8) break;
        if ((puVar7 <= puVar11) ||
           (bVar2 = 0x38 < uVar10, uVar10 = uVar10 + 7, puVar8 = puVar11, bVar2))
        goto switchD_00259a69_caseD_3;
      }
      local_60.int_value_ = uVar5 & 0xffffffff00000000;
      break;
    case 1:
      puVar11 = puVar8 + 1;
      if (puVar7 < puVar11) goto switchD_00259a69_caseD_3;
      uVar5 = *puVar8;
      local_60.int_value_ = uVar5 & 0xffffffff00000000;
      break;
    case 2:
      puVar8 = (ulong *)((long)puVar8 + 1);
      uVar10 = 0;
      uVar5 = 0;
      puVar11 = puVar8;
      while (uVar10 = (ulong)(*(byte *)((long)puVar11 + -1) & 0x7f) << ((byte)uVar5 & 0x3f) | uVar10
            , (char)*(byte *)((long)puVar11 + -1) < '\0') {
        if (puVar7 <= puVar11) goto switchD_00259a69_caseD_3;
        puVar11 = (ulong *)((long)puVar11 + 1);
        puVar8 = (ulong *)((long)puVar8 + 1);
        bVar2 = 0x38 < uVar5;
        uVar5 = uVar5 + 7;
        if (bVar2) goto switchD_00259a69_caseD_3;
      }
      if (uVar10 <= (ulong)((long)puVar7 - (long)puVar8)) {
        local_60.int_value_ = (ulong)puVar8 & 0xffffffff00000000;
        puVar11 = (ulong *)((long)puVar11 + uVar10);
        uVar5 = (ulong)puVar8 & 0xffffffff;
        goto LAB_00259b46;
      }
    default:
      goto switchD_00259a69_caseD_3;
    case 5:
      puVar11 = (ulong *)((long)puVar8 + 4);
      if (puVar7 < puVar11) goto switchD_00259a69_caseD_3;
      uVar5 = (ulong)(uint)*puVar8;
      local_60.int_value_ = 0;
    }
    uVar10 = 0;
LAB_00259b46:
    raw = puVar11;
  } while ((0xffff < (uint)uVar3) || (0xfffffff < uVar10));
  local_60.int_value_ = local_60.int_value_ | uVar5 & 0xffffffff;
  uVar5 = uVar3 << 0x20 | uVar10;
  local_60.type_ = (byte)(uVar5 >> 0x30) | (byte)uVar6 & 7;
  local_60.size_ = (uint32_t)uVar10;
  local_60.id_ = (uint16_t)(uVar5 >> 0x20);
  if ((short)uVar3 != 0) {
    local_40 = &this->shm_key_windows_;
    local_48 = &this->sdk_version_;
    local_50 = &this->producer_name_;
    do {
      if ((ushort)uVar3 < 9) {
        (this->_has_field_).super__Base_bitset<1UL>._M_w =
             (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar3 & 0x3f);
      }
      IVar9 = (InitializeConnectionRequest_ProducerSMBScrapingMode)local_60.int_value_;
      raw = puVar11;
      switch((uint)uVar3 & 0xffff) {
      case 1:
        this->shared_memory_page_size_hint_bytes_ = IVar9;
        break;
      case 2:
        this->shared_memory_size_hint_bytes_ = IVar9;
        break;
      case 3:
        protozero::Field::get(&local_60,local_50);
        break;
      case 4:
        this->smb_scraping_mode_ = IVar9;
        break;
      default:
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_60,local_38);
        break;
      case 6:
        this->producer_provided_shmem_ = local_60.int_value_ != 0;
        break;
      case 7:
        protozero::Field::get(&local_60,local_40);
        break;
      case 8:
        protozero::Field::get(&local_60,local_48);
      }
      do {
        if (puVar7 <= raw) goto switchD_00259a69_caseD_3;
        bVar1 = (byte)*raw;
        uVar6 = (ulong)(uint)bVar1;
        puVar8 = (ulong *)((long)raw + 1);
        if ((char)bVar1 < '\0') {
          uVar6 = (ulong)(bVar1 & 0x7f);
          lVar4 = 7;
          do {
            if ((puVar7 <= puVar8) || (0x38 < lVar4 - 7U)) goto switchD_00259a69_caseD_3;
            uVar3 = *puVar8;
            puVar8 = (ulong *)((long)puVar8 + 1);
            uVar6 = uVar6 | (ulong)((byte)uVar3 & 0x7f) << ((byte)lVar4 & 0x3f);
            lVar4 = lVar4 + 7;
          } while ((char)(byte)uVar3 < '\0');
        }
        uVar3 = uVar6 >> 3;
        if (((uint)uVar3 == 0) || (puVar7 <= puVar8)) goto switchD_00259a69_caseD_3;
        switch((uint)uVar6 & 7) {
        case 0:
          uVar5 = 0;
          uVar10 = 0;
          while( true ) {
            puVar11 = (ulong *)((long)puVar8 + 1);
            uVar5 = (ulong)((byte)*puVar8 & 0x7f) << ((byte)uVar10 & 0x3f) | uVar5;
            if (-1 < (char)(byte)*puVar8) break;
            if ((puVar7 <= puVar11) ||
               (bVar2 = 0x38 < uVar10, uVar10 = uVar10 + 7, puVar8 = puVar11, bVar2))
            goto switchD_00259a69_caseD_3;
          }
          local_60.int_value_ = uVar5 & 0xffffffff00000000;
          break;
        case 1:
          puVar11 = puVar8 + 1;
          if (puVar7 < puVar11) goto switchD_00259a69_caseD_3;
          uVar5 = *puVar8;
          local_60.int_value_ = uVar5 & 0xffffffff00000000;
          break;
        case 2:
          puVar8 = (ulong *)((long)puVar8 + 1);
          uVar10 = 0;
          uVar5 = 0;
          puVar11 = puVar8;
          while (uVar10 = (ulong)(*(byte *)((long)puVar11 + -1) & 0x7f) << ((byte)uVar5 & 0x3f) |
                          uVar10, (char)*(byte *)((long)puVar11 + -1) < '\0') {
            if (puVar7 <= puVar11) goto switchD_00259a69_caseD_3;
            puVar11 = (ulong *)((long)puVar11 + 1);
            puVar8 = (ulong *)((long)puVar8 + 1);
            bVar2 = 0x38 < uVar5;
            uVar5 = uVar5 + 7;
            if (bVar2) goto switchD_00259a69_caseD_3;
          }
          if (uVar10 <= (ulong)((long)puVar7 - (long)puVar8)) {
            local_60.int_value_ = (ulong)puVar8 & 0xffffffff00000000;
            puVar11 = (ulong *)((long)puVar11 + uVar10);
            uVar5 = (ulong)puVar8 & 0xffffffff;
            goto LAB_00259e59;
          }
        default:
          goto switchD_00259a69_caseD_3;
        case 5:
          puVar11 = (ulong *)((long)puVar8 + 4);
          if (puVar7 < puVar11) goto switchD_00259a69_caseD_3;
          uVar5 = (ulong)(uint)*puVar8;
          local_60.int_value_ = 0;
        }
        uVar10 = 0;
LAB_00259e59:
        raw = puVar11;
      } while ((0xffff < (uint)uVar3) || (0xfffffff < uVar10));
      local_60.int_value_ = local_60.int_value_ | uVar5 & 0xffffffff;
      uVar5 = uVar3 << 0x20 | uVar10;
      local_60.type_ = (byte)(uVar5 >> 0x30) | (byte)uVar6 & 7;
      local_60.size_ = (uint32_t)uVar10;
      local_60.id_ = (uint16_t)(uVar5 >> 0x20);
    } while ((short)uVar3 != 0);
  }
switchD_00259a69_caseD_3:
  return puVar7 == (ulong *)raw;
}

Assistant:

bool InitializeConnectionRequest::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* shared_memory_page_size_hint_bytes */:
        field.get(&shared_memory_page_size_hint_bytes_);
        break;
      case 2 /* shared_memory_size_hint_bytes */:
        field.get(&shared_memory_size_hint_bytes_);
        break;
      case 3 /* producer_name */:
        field.get(&producer_name_);
        break;
      case 4 /* smb_scraping_mode */:
        field.get(&smb_scraping_mode_);
        break;
      case 6 /* producer_provided_shmem */:
        field.get(&producer_provided_shmem_);
        break;
      case 8 /* sdk_version */:
        field.get(&sdk_version_);
        break;
      case 7 /* shm_key_windows */:
        field.get(&shm_key_windows_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}